

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O3

void pbrt::detail::
     stringPrintfRecursive<int_const&,int_const&,int_const&,bool_const&,int_const&,pbrt::RNG_const&>
               (string *s,char *fmt,int *v,int *args,int *args_1,bool *args_2,int *args_3,
               RNG *args_4)

{
  _Alloc_hider _Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  char cVar7;
  char *fmt_local;
  string nextFmt;
  string str_1;
  long *local_1d8;
  long local_1c8 [2];
  string str;
  ios_base local_138 [264];
  
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  cVar7 = (char)&nextFmt;
  lVar3 = std::__cxx11::string::find(cVar7,0x2a);
  lVar4 = std::__cxx11::string::find(cVar7,0x73);
  lVar5 = std::__cxx11::string::find(cVar7,100);
  _Var1 = nextFmt._M_dataplus;
  if (lVar3 != -1) {
    stringPrintfRecursiveWithPrecision<int_const&,int_const&,bool_const&,int_const&,pbrt::RNG_const&>
              (s,fmt_local,&nextFmt,*v,args,args_1,args_2,args_3,args_4);
    goto LAB_00407c6b;
  }
  if (lVar5 == -1) {
    if (lVar4 == -1) {
      if (nextFmt._M_string_length == 0) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
                 ,0x10d,"Excess values passed to Printf.");
      }
      iVar2 = snprintf((char *)0x0,0,nextFmt._M_dataplus._M_p,(ulong)(uint)*v);
      str._M_dataplus._M_p = (pointer)&str.field_2;
      str._M_string_length = 0;
      str.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::resize((ulong)&str,(char)(iVar2 + 1));
      snprintf(str._M_dataplus._M_p,(long)(iVar2 + 1),_Var1._M_p,(ulong)(uint)*v);
      std::__cxx11::string::pop_back();
      std::__cxx11::string::_M_append((char *)s,(ulong)str._M_dataplus._M_p);
      goto LAB_00407ae6;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&str);
    std::ostream::operator<<((ostream *)str.field_2._M_local_buf,*v);
    _Var1 = nextFmt._M_dataplus;
    std::__cxx11::stringbuf::str();
    iVar2 = snprintf((char *)0x0,0,_Var1._M_p,local_1d8);
    str_1._M_string_length = 0;
    str_1.field_2._M_local_buf[0] = '\0';
    str_1._M_dataplus._M_p = (pointer)&str_1.field_2;
    std::__cxx11::string::resize((ulong)&str_1,(char)(iVar2 + 1));
    snprintf(str_1._M_dataplus._M_p,(long)(iVar2 + 1),_Var1._M_p,local_1d8);
    std::__cxx11::string::pop_back();
    std::__cxx11::string::_M_append((char *)s,(ulong)str_1._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str_1._M_dataplus._M_p != &str_1.field_2) {
      operator_delete(str_1._M_dataplus._M_p,
                      CONCAT71(str_1.field_2._M_allocated_capacity._1_7_,
                               str_1.field_2._M_local_buf[0]) + 1);
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&str);
    std::ios_base::~ios_base(local_138);
  }
  else {
    uVar6 = std::__cxx11::string::find((char)&nextFmt,100);
    std::__cxx11::string::replace((ulong)&nextFmt,uVar6,(char *)0x1,0x7a43fe);
    _Var1 = nextFmt._M_dataplus;
    iVar2 = snprintf((char *)0x0,0,nextFmt._M_dataplus._M_p,(ulong)(uint)*v);
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)&str,(char)(iVar2 + 1));
    snprintf(str._M_dataplus._M_p,(long)(iVar2 + 1),_Var1._M_p,(ulong)(uint)*v);
    std::__cxx11::string::pop_back();
    std::__cxx11::string::_M_append((char *)s,(ulong)str._M_dataplus._M_p);
LAB_00407ae6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,
                      CONCAT71(str.field_2._M_allocated_capacity._1_7_,str.field_2._M_local_buf[0])
                      + 1);
    }
  }
  stringPrintfRecursive<int_const&,int_const&,bool_const&,int_const&,pbrt::RNG_const&>
            (s,fmt_local,args,args_1,args_2,args_3,args_4);
LAB_00407c6b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nextFmt._M_dataplus._M_p != &nextFmt.field_2) {
    operator_delete(nextFmt._M_dataplus._M_p,nextFmt.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}